

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcFooting::~IfcFooting(IfcFooting *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)this = 0x877218;
  *(undefined8 *)&this->field_0x178 = 0x877330;
  *(undefined8 *)&this->field_0x88 = 0x877240;
  *(undefined8 *)&this->field_0x98 = 0x877268;
  *(undefined8 *)&this->field_0xd0 = 0x877290;
  *(undefined8 *)&this->field_0x100 = 0x8772b8;
  *(undefined8 *)&this->field_0x138 = 0x8772e0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x877308;
  puVar2 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>).field_0x10;
  puVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcFooting,_1UL>).field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this,&PTR_construction_vtable_24__00877350);
  operator_delete(this,400);
  return;
}

Assistant:

IfcFooting() : Object("IfcFooting") {}